

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
::rehash(sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  EntryPointer begin;
  EntryPointer psVar1;
  int8_t iVar2;
  size_t sVar3;
  ulong uVar4;
  sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>
  *psVar5;
  long lVar6;
  byte bVar7;
  anon_union_56_1_a8c68091_for_sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_3
  *key;
  double dVar8;
  size_t local_38;
  
  local_38 = num_buckets;
  dVar8 = ceil((((double)CONCAT44(0x45300000,(int)(this->num_elements >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->num_elements) - 4503599627370496.0)) /
               (double)this->_max_load_factor);
  local_38 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 != 0) {
    iVar2 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
    sVar3 = this->num_slots_minus_one;
    if (sVar3 != 0) {
      sVar3 = sVar3 + 1;
    }
    if (local_38 != sVar3) {
      uVar4 = local_38 >> 1 | local_38;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      uVar4 = uVar4 >> 0x10 | uVar4;
      uVar4 = uVar4 >> 0x20 | uVar4;
      bVar7 = 4;
      if ('\x04' < (char)log2(unsigned_long)::table
                         [(uVar4 - (uVar4 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
        bVar7 = log2(unsigned_long)::table[(uVar4 - (uVar4 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
      }
      psVar5 = __gnu_cxx::
               new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>
               ::allocate((new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>
                           *)this,local_38 + bVar7,(void *)0x0);
      if (psVar5 != psVar5 + local_38 + ((ulong)bVar7 - 1)) {
        lVar6 = 0;
        do {
          (&psVar5->distance_from_desired)[lVar6] = -1;
          lVar6 = lVar6 + 0x40;
        } while (local_38 * 0x40 + (ulong)bVar7 * 0x40 + -0x40 != lVar6);
      }
      psVar5[local_38 + ((ulong)bVar7 - 1)].distance_from_desired = '\0';
      begin = this->entries;
      sVar3 = this->num_slots_minus_one;
      this->entries = psVar5;
      this->num_slots_minus_one = local_38;
      this->num_slots_minus_one = local_38 - 1;
      (this->hash_policy).shift = iVar2;
      max_lookups = this->max_lookups;
      this->max_lookups = bVar7;
      this->num_elements = 0;
      local_38 = sVar3;
      if (begin != begin + sVar3 + (long)max_lookups) {
        lVar6 = sVar3 * 0x40 + (long)max_lookups * 0x40;
        psVar1 = begin;
        do {
          key = &psVar1->field_1;
          if (-1 < *(char *)((long)&key[-1].value + 0x30)) {
            sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
            ::
            emplace<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>
                      ((sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
                        *)this,&key->value);
            *(undefined1 *)((long)&key[-1].value + 0x30) = 0xff;
          }
          psVar1 = (EntryPointer)(key + 1);
          lVar6 = lVar6 + -0x40;
        } while (lVar6 != 0);
      }
      deallocate_data(this,begin,local_38,max_lookups);
    }
    return;
  }
  reset_to_empty_state(this);
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }